

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O2

cubeb_resampler_stats * __thiscall
cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
::stats(cubeb_resampler_stats *__return_storage_ptr__,
       cubeb_resampler_speex<float,_cubeb_resampler_speex_one_way<float>,_cubeb_resampler_speex_one_way<float>_>
       *this)

{
  cubeb_resampler_speex_one_way<float> *pcVar1;
  
  __return_storage_ptr__->output_input_buffer_size = 0;
  __return_storage_ptr__->output_output_buffer_size = 0;
  __return_storage_ptr__->input_input_buffer_size = 0;
  __return_storage_ptr__->input_output_buffer_size = 0;
  pcVar1 = (this->input_processor)._M_t.
           super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
  if (pcVar1 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    __return_storage_ptr__->input_input_buffer_size = (pcVar1->resampling_in_buffer).length_;
    __return_storage_ptr__->input_output_buffer_size = (pcVar1->resampling_out_buffer).length_;
  }
  pcVar1 = (this->output_processor)._M_t.
           super___uniq_ptr_impl<cubeb_resampler_speex_one_way<float>,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_cubeb_resampler_speex_one_way<float>_*,_std::default_delete<cubeb_resampler_speex_one_way<float>_>_>
           .super__Head_base<0UL,_cubeb_resampler_speex_one_way<float>_*,_false>._M_head_impl;
  if (pcVar1 != (cubeb_resampler_speex_one_way<float> *)0x0) {
    __return_storage_ptr__->output_input_buffer_size = (pcVar1->resampling_in_buffer).length_;
    __return_storage_ptr__->output_output_buffer_size = (pcVar1->resampling_out_buffer).length_;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual cubeb_resampler_stats stats()
  {
    cubeb_resampler_stats stats = {};
    if (input_processor) {
      stats.input_input_buffer_size = input_processor->input_buffer_size();
      stats.input_output_buffer_size = input_processor->output_buffer_size();
    }
    if (output_processor) {
      stats.output_input_buffer_size = output_processor->input_buffer_size();
      stats.output_output_buffer_size = output_processor->output_buffer_size();
    }
    return stats;
  }